

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O2

qsizetype __thiscall QByteArrayView::indexOf(QByteArrayView *this,char ch,qsizetype from)

{
  qsizetype qVar1;
  undefined7 in_register_00000031;
  char in_R8B;
  QByteArrayView haystack;
  
  haystack.m_data = (storage_type *)from;
  haystack.m_size = (qsizetype)this->m_data;
  qVar1 = QtPrivate::findByteArray
                    ((QtPrivate *)this->m_size,haystack,
                     CONCAT71(in_register_00000031,ch) & 0xffffffff,in_R8B);
  return qVar1;
}

Assistant:

[[nodiscard]] qsizetype indexOf(char ch, qsizetype from = 0) const noexcept
    { return QtPrivate::findByteArray(*this, from, ch); }